

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ImTextureID pvVar5;
  ImDrawCmd *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImDrawCmd *__dest;
  int iVar9;
  int iVar10;
  undefined1 in_ZMM1 [64];
  
  IVar1 = (this->_CmdHeader).ClipRect;
  auVar8 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x40);
  auVar8 = vcmpps_avx((undefined1  [16])IVar1,auVar8,2);
  auVar7 = vshufps_avx(auVar8,auVar8,0x50);
  auVar8 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  if (((auVar8 & ~auVar7) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar8 & ~auVar7,0xf)) {
    pvVar5 = (this->_CmdHeader).TextureId;
    uVar2 = (this->_CmdHeader).VtxOffset;
    uVar3 = (this->IdxBuffer).Size;
    iVar10 = (this->CmdBuffer).Size;
    iVar4 = (this->CmdBuffer).Capacity;
    if (iVar10 == iVar4) {
      iVar10 = iVar10 + 1;
      if (iVar4 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar4 / 2 + iVar4;
      }
      if (iVar10 < iVar9) {
        iVar10 = iVar9;
      }
      if (iVar4 < iVar10) {
        __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x38);
        pIVar6 = (this->CmdBuffer).Data;
        if (pIVar6 != (ImDrawCmd *)0x0) {
          memcpy(__dest,pIVar6,(long)(this->CmdBuffer).Size * 0x38);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = __dest;
        (this->CmdBuffer).Capacity = iVar10;
      }
    }
    pIVar6 = (this->CmdBuffer).Data;
    iVar10 = (this->CmdBuffer).Size;
    pIVar6[iVar10].ClipRect = IVar1;
    pIVar6[iVar10].TextureId = pvVar5;
    pIVar6[iVar10].VtxOffset = uVar2;
    pIVar6[iVar10].IdxOffset = uVar3;
    *(undefined8 *)&pIVar6[iVar10].ElemCount = 0;
    *(ImDrawCallback *)(&pIVar6[iVar10].ElemCount + 2) = (ImDrawCallback)0x0;
    pIVar6[iVar10].UserCallbackData = (void *)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                ,0x1c1,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}